

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O3

time_t RelativeMonth(time_t Start,time_t Timezone,time_t RelMonth)

{
  tm *ptVar1;
  time_t tVar2;
  long lVar3;
  time_t Start_local;
  tm_conflict1 tmbuf;
  
  if (RelMonth == 0) {
    tVar2 = 0;
  }
  else {
    Start_local = Start;
    ptVar1 = localtime_r(&Start_local,(tm *)&tmbuf);
    lVar3 = ptVar1->tm_mon + RelMonth + (long)(ptVar1->tm_year * 0xc + 0x5910);
    Convert(lVar3 % 0xc + 1,(long)ptVar1->tm_mday,lVar3 / 0xc,(long)ptVar1->tm_hour,
            (long)ptVar1->tm_min,(long)ptVar1->tm_sec,Timezone,DSTmaybe);
    tVar2 = DSTcorrect(Start_local,0x185f09);
  }
  return tVar2;
}

Assistant:

static time_t
RelativeMonth(time_t Start, time_t Timezone, time_t RelMonth)
{
	struct tm	*tm;
	time_t	Month;
	time_t	Year;
#if defined(HAVE_LOCALTIME_R) || defined(HAVE__LOCALTIME64_S)
	struct tm	tmbuf;
#endif
#if defined(HAVE__LOCALTIME64_S)
	errno_t		terr;
	__time64_t	tmptime;
#endif

	if (RelMonth == 0)
		return 0;
#if defined(HAVE_LOCALTIME_R)
	tm = localtime_r(&Start, &tmbuf);
#elif defined(HAVE__LOCALTIME64_S)
	tmptime = Start;
	terr = _localtime64_s(&tmbuf, &tmptime);
	if (terr)
		tm = NULL;
	else
		tm = &tmbuf;
#else
	tm = localtime(&Start);
#endif
	Month = 12 * (tm->tm_year + 1900) + tm->tm_mon + RelMonth;
	Year = Month / 12;
	Month = Month % 12 + 1;
	return DSTcorrect(Start,
	    Convert(Month, (time_t)tm->tm_mday, Year,
		(time_t)tm->tm_hour, (time_t)tm->tm_min, (time_t)tm->tm_sec,
		Timezone, DSTmaybe));
}